

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

void xmlSchemaClearElemInfo(xmlSchemaValidCtxtPtr vctxt,xmlSchemaNodeInfoPtr ielem)

{
  xmlSchemaNodeInfoPtr ielem_local;
  xmlSchemaValidCtxtPtr vctxt_local;
  
  ielem->hasKeyrefs = 0;
  ielem->appliedXPath = 0;
  if ((ielem->flags & 1U) == 0) {
    ielem->localName = (xmlChar *)0x0;
    ielem->nsName = (xmlChar *)0x0;
  }
  else {
    if (ielem->localName != (xmlChar *)0x0) {
      (*xmlFree)(ielem->localName);
      ielem->localName = (xmlChar *)0x0;
    }
    if (ielem->nsName != (xmlChar *)0x0) {
      (*xmlFree)(ielem->nsName);
      ielem->nsName = (xmlChar *)0x0;
    }
  }
  if ((ielem->flags & 2U) == 0) {
    ielem->value = (xmlChar *)0x0;
  }
  else if (ielem->value != (xmlChar *)0x0) {
    (*xmlFree)(ielem->value);
    ielem->value = (xmlChar *)0x0;
  }
  if (ielem->val != (xmlSchemaValPtr)0x0) {
    xmlSchemaFreeValue(ielem->val);
    ielem->val = (xmlSchemaValPtr)0x0;
  }
  if (ielem->idcMatchers != (xmlSchemaIDCMatcherPtr_conflict)0x0) {
    xmlSchemaIDCReleaseMatcherList(vctxt,ielem->idcMatchers);
    ielem->idcMatchers = (xmlSchemaIDCMatcherPtr_conflict)0x0;
  }
  if (ielem->idcTable != (xmlSchemaPSVIIDCBindingPtr_conflict)0x0) {
    xmlSchemaIDCFreeIDCTable(ielem->idcTable);
    ielem->idcTable = (xmlSchemaPSVIIDCBindingPtr_conflict)0x0;
  }
  if (ielem->regexCtxt != (xmlRegExecCtxtPtr)0x0) {
    xmlRegFreeExecCtxt(ielem->regexCtxt);
    ielem->regexCtxt = (xmlRegExecCtxtPtr)0x0;
  }
  if (ielem->nsBindings != (xmlChar **)0x0) {
    (*xmlFree)(ielem->nsBindings);
    ielem->nsBindings = (xmlChar **)0x0;
    ielem->nbNsBindings = 0;
    ielem->sizeNsBindings = 0;
  }
  return;
}

Assistant:

static void
xmlSchemaClearElemInfo(xmlSchemaValidCtxtPtr vctxt,
		       xmlSchemaNodeInfoPtr ielem)
{
    ielem->hasKeyrefs = 0;
    ielem->appliedXPath = 0;
    if (ielem->flags & XML_SCHEMA_NODE_INFO_FLAG_OWNED_NAMES) {
	FREE_AND_NULL(ielem->localName);
	FREE_AND_NULL(ielem->nsName);
    } else {
	ielem->localName = NULL;
	ielem->nsName = NULL;
    }
    if (ielem->flags & XML_SCHEMA_NODE_INFO_FLAG_OWNED_VALUES) {
	FREE_AND_NULL(ielem->value);
    } else {
	ielem->value = NULL;
    }
    if (ielem->val != NULL) {
	/*
	* PSVI TODO: Be careful not to free it when the value is
	* exposed via PSVI.
	*/
	xmlSchemaFreeValue(ielem->val);
	ielem->val = NULL;
    }
    if (ielem->idcMatchers != NULL) {
	/*
	* REVISIT OPTIMIZE TODO: Use a pool of IDC matchers.
	*   Does it work?
	*/
	xmlSchemaIDCReleaseMatcherList(vctxt, ielem->idcMatchers);
#if 0
	xmlSchemaIDCFreeMatcherList(ielem->idcMatchers);
#endif
	ielem->idcMatchers = NULL;
    }
    if (ielem->idcTable != NULL) {
	/*
	* OPTIMIZE TODO: Use a pool of IDC tables??.
	*/
	xmlSchemaIDCFreeIDCTable(ielem->idcTable);
	ielem->idcTable = NULL;
    }
    if (ielem->regexCtxt != NULL) {
	xmlRegFreeExecCtxt(ielem->regexCtxt);
	ielem->regexCtxt = NULL;
    }
    if (ielem->nsBindings != NULL) {
	xmlFree((xmlChar **)ielem->nsBindings);
	ielem->nsBindings = NULL;
	ielem->nbNsBindings = 0;
	ielem->sizeNsBindings = 0;
    }
}